

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.c
# Opt level: O2

void MultAddPrime89(uint64_t *r,uint64_t x,uint64_t *a,uint64_t *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = x & 0xffffffff;
  uVar7 = x >> 0x20;
  uVar8 = a[1] * uVar7;
  uVar6 = a[2] * uVar4;
  uVar1 = a[2] * uVar7;
  uVar7 = uVar7 * *a;
  uVar2 = a[1] * uVar4;
  uVar4 = *a * uVar4;
  uVar5 = uVar1 * 0x80;
  uVar3 = (uVar7 & 0x1ffffffffffffff) + (uVar2 & 0x1ffffffffffffff);
  uVar7 = (uVar7 >> 0x39) + (uVar2 >> 0x39) + (uVar8 >> 0x19) + (uVar6 >> 0x19);
  uVar2 = (uVar5 & 0xffffffff) + *b + (uVar7 & 0xffffffff) + (uVar4 & 0xffffffff);
  *r = uVar2 & 0xffffffff;
  uVar2 = (uVar5 >> 0x20) + (uVar4 >> 0x20) + b[1] + (uVar3 & 0xffffffff) + (uVar7 >> 0x20) +
          (uVar2 >> 0x20);
  r[1] = uVar2 & 0xffffffff;
  r[2] = (uVar3 >> 0x20) + (uVar1 >> 0x39) + (uVar6 & 0x1ffffff) + (uVar8 & 0x1ffffff) + b[2] +
         (uVar2 >> 0x20);
  return;
}

Assistant:

static void
MultAddPrime89(INT96 r, uint64_t x, const INT96 a, const INT96 b)
{
#define LOW(x) ((x)&0xFFFFFFFF)
#define HIGH(x) ((x)>>32)
    uint64_t x1, x0, c21, c20, c11, c10, c01, c00;
    uint64_t d0, d1, d2, d3;
    uint64_t s0, s1, carry;
    x1 = HIGH(x);
    x0 = LOW(x);
    c21 = a[2]*x1;
    c11 = a[1]*x1;
    c01 = a[0]*x1;
    c20 = a[2]*x0;
    c10 = a[1]*x0;
    c00 = a[0]*x0;
    d0 = (c20>>25)+(c11>>25)+(c10>>57)+(c01>>57);
    d1 = (c21<<7);
    d2 = (c10&Prime89_21) + (c01&Prime89_21);
    d3 = (c20&Prime89_2) + (c11&Prime89_2) + (c21>>57);
    s0 = b[0] + LOW(c00) + LOW(d0) + LOW(d1);
    r[0] = LOW(s0);
    carry = HIGH(s0);
    s1 = b[1] + HIGH(c00) + HIGH(d0) + HIGH(d1) + LOW(d2) + carry;
    r[1] = LOW(s1);
    carry = HIGH(s1);
    r[2] = b[2] + HIGH(d2) + d3 + carry;
#undef LOW
#undef HIGH
}